

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

void Abc_NtkShow6VarFunc(char *pF0,char *pF1)

{
  ulong uVar1;
  word F1;
  word F0;
  word local_28;
  word local_20;
  
  uVar1 = strlen(pF0);
  if (uVar1 == 0x10) {
    uVar1 = strlen(pF1);
    if (uVar1 == 0x10) {
      Extra_ReadHexadecimal((uint *)&local_20,pF0,6);
      Extra_ReadHexadecimal((uint *)&local_28,pF1,6);
      Abc_Show6VarFunc(local_20,local_28);
      return;
    }
  }
  printf("Wrong length (%d) of 6-var truth table.\n",uVar1 & 0xffffffff);
  return;
}

Assistant:

void Abc_NtkShow6VarFunc( char * pF0, char * pF1 )
{
    word F0, F1;
    if ( strlen(pF0) != 16 )
    {
        printf( "Wrong length (%d) of 6-var truth table.\n", (int)strlen(pF0) );
        return;
    }
    if ( strlen(pF1) != 16 )
    {
        printf( "Wrong length (%d) of 6-var truth table.\n", (int)strlen(pF1) );
        return;
    }
    Extra_ReadHexadecimal( (unsigned *)&F0, pF0, 6 );
    Extra_ReadHexadecimal( (unsigned *)&F1, pF1, 6 );
    Abc_Show6VarFunc( F0, F1 );
}